

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall
QScrollerPrivate::handleDrag(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  QScrollerPropertiesPrivate *pQVar1;
  long lVar2;
  QPointF QVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  QDebug *pQVar13;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  ulong uVar17;
  int t;
  undefined4 uVar18;
  int t_00;
  undefined4 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  QDebug local_50;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  dVar4 = position->xp - (this->lastPosition).xp;
  dVar5 = position->yp - (this->lastPosition).yp;
  local_48.yp._0_4_ = SUB84(dVar5,0);
  local_48.xp = dVar4;
  local_48.yp._4_4_ = (int)((ulong)dVar5 >> 0x20);
  lVar2 = this->lastTimestamp;
  if ((pQVar1->axisLockThreshold != 0.0) || (NAN(pQVar1->axisLockThreshold))) {
    uVar16 = -(ulong)(dVar4 < -dVar4);
    uVar17 = -(ulong)(dVar5 < -dVar5);
    uVar7 = (ulong)-dVar5 & uVar17;
    auVar20._0_8_ = ~uVar16 & (ulong)dVar4;
    auVar20._8_8_ = ~uVar17 & (ulong)dVar5;
    auVar6._8_4_ = (int)uVar7;
    auVar6._0_8_ = (ulong)-dVar4 & uVar16;
    auVar6._12_4_ = (int)(uVar7 >> 0x20);
    t = (int)SUB168(auVar20 | auVar6,0);
    t_00 = (int)SUB168(auVar20 | auVar6,8);
    auVar21._0_4_ = -(uint)(t == 0);
    auVar21._4_4_ = -(uint)(t == 0);
    auVar21._8_4_ = -(uint)(t_00 == 0);
    auVar21._12_4_ = -(uint)(t_00 == 0);
    iVar11 = movmskpd((int)local_38,auVar21);
    if (iVar11 != 3) {
      iVar11 = t;
      if (t_00 < t) {
        iVar11 = t_00;
      }
      iVar12 = t;
      if (t < t_00) {
        iVar12 = t_00;
      }
      lcScroller();
      if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        QMessageLogger::debug();
        pQVar13 = QDebug::operator<<(&local_50,"QScroller::handleDrag() -- axis lock:");
        pQVar13 = QDebug::operator<<(pQVar13,(double)iVar11 / (double)iVar12);
        pQVar13 = QDebug::operator<<(pQVar13," / ");
        pQVar13 = QDebug::operator<<(pQVar13,pQVar1->axisLockThreshold);
        pQVar13 = QDebug::operator<<(pQVar13,"- isvertical:");
        pQVar13 = QDebug::operator<<(pQVar13,t < t_00);
        pQVar13 = QDebug::operator<<(pQVar13,"- dx:");
        pQVar13 = QDebug::operator<<(pQVar13,t);
        pQVar13 = QDebug::operator<<(pQVar13,"- dy:");
        QDebug::operator<<(pQVar13,t_00);
        QDebug::~QDebug(&local_50);
      }
      if ((double)iVar11 / (double)iVar12 <= pQVar1->axisLockThreshold) {
        if (t < t_00) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_48.yp;
          local_48 = (QPointF)(auVar9 << 0x40);
        }
        else {
          local_48.yp = 0.0;
        }
      }
    }
  }
  updateVelocity(this,&local_48,timestamp - lVar2);
  bVar15 = true;
  bVar14 = true;
  if ((this->contentPosRange).w <= 0.0) {
    bVar14 = pQVar1->hOvershootPolicy == OvershootAlwaysOn;
  }
  if ((this->contentPosRange).h <= 0.0) {
    bVar15 = pQVar1->vOvershootPolicy == OvershootAlwaysOn;
  }
  if (!bVar14) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_48.yp;
    local_48 = (QPointF)(auVar10 << 0x40);
    (this->releaseVelocity).xp = 0.0;
  }
  if (bVar15) {
    uVar18 = local_48.yp._0_4_;
    uVar19 = local_48.yp._4_4_;
  }
  else {
    (this->releaseVelocity).yp = 0.0;
    uVar18 = 0;
    uVar19 = 0;
  }
  dVar4 = (this->dragDistance).yp + (double)CONCAT44(uVar19,uVar18);
  QVar3.yp._0_4_ = SUB84(dVar4,0);
  QVar3.xp = (this->dragDistance).xp + local_48.xp;
  QVar3.yp._4_4_ = (int)((ulong)dVar4 >> 0x20);
  this->dragDistance = QVar3;
  uVar18 = *(undefined4 *)((long)&position->xp + 4);
  uVar19 = *(undefined4 *)&position->yp;
  uVar8 = *(undefined4 *)((long)&position->yp + 4);
  *(undefined4 *)&(this->lastPosition).xp = *(undefined4 *)&position->xp;
  *(undefined4 *)((long)&(this->lastPosition).xp + 4) = uVar18;
  *(undefined4 *)&(this->lastPosition).yp = uVar19;
  *(undefined4 *)((long)&(this->lastPosition).yp + 4) = uVar8;
  this->lastTimestamp = timestamp;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::handleDrag(const QPointF &position, qint64 timestamp)
{
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    QPointF deltaPixel = position - lastPosition;
    qint64 deltaTime = timestamp - lastTimestamp;

    if (sp->axisLockThreshold) {
        int dx = qAbs(deltaPixel.x());
        int dy = qAbs(deltaPixel.y());
        if (dx || dy) {
            bool vertical = (dy > dx);
            qreal alpha = qreal(vertical ? dx : dy) / qreal(vertical ? dy : dx);
            qCDebug(lcScroller) << "QScroller::handleDrag() -- axis lock:" << alpha << " / " << sp->axisLockThreshold
                                << "- isvertical:" << vertical << "- dx:" << dx << "- dy:" << dy;
            if (alpha <= sp->axisLockThreshold) {
                if (vertical)
                    deltaPixel.setX(0);
                else
                    deltaPixel.setY(0);
            }
        }
    }

    // calculate velocity (if the user would release the mouse NOW)
    updateVelocity(deltaPixel, deltaTime);

    // restrict velocity, if content is not scrollable
    QRectF max = contentPosRange;
    bool canScrollX = (max.width() > 0) || (sp->hOvershootPolicy == QScrollerProperties::OvershootAlwaysOn);
    bool canScrollY = (max.height() > 0) || (sp->vOvershootPolicy == QScrollerProperties::OvershootAlwaysOn);

    if (!canScrollX) {
        deltaPixel.setX(0);
        releaseVelocity.setX(0);
    }
    if (!canScrollY) {
        deltaPixel.setY(0);
        releaseVelocity.setY(0);
    }

    dragDistance += deltaPixel;
    lastPosition = position;
    lastTimestamp = timestamp;
}